

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::vector3f>
          (Attribute *this,double t,vector3f *dst,TimeSampleInterpolationType tinterp)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::vector3f> v;
  optional<tinyusdz::value::vector3f> local_48;
  optional<tinyusdz::value::vector3f> local_38;
  
  if (dst == (vector3f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar2 = primvar::PrimVar::has_value(&this->_var);
    if (bVar2) {
      primvar::PrimVar::get_value<tinyusdz::value::vector3f>(&local_48,&this->_var);
      local_38.has_value_ = local_48.has_value_;
      if (local_48.has_value_ != false) {
        local_38.contained._8_4_ = local_48.contained._8_4_;
        local_38.contained._0_8_ = local_48.contained._0_8_;
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3f>::value(&local_38);
        fVar1 = pvVar3->y;
        dst->x = pvVar3->x;
        dst->y = fVar1;
        dst->z = pvVar3->z;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<tinyusdz::value::vector3f>(this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::vector3f>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }